

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset_container_unit.c
# Opt level: O0

int main(void)

{
  int iVar1;
  CMUnitTest tests [10];
  undefined1 auStackY_198 [128];
  CMFixtureFunction in_stack_fffffffffffffee8;
  CMFixtureFunction in_stack_fffffffffffffef0;
  size_t in_stack_fffffffffffffef8;
  CMUnitTest *in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff08;
  
  memcpy(auStackY_198,&PTR_anon_var_dwarf_23_00182c40,400);
  iVar1 = _cmocka_run_group_tests
                    (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                     in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  return iVar1;
}

Assistant:

int main() {
    const struct CMUnitTest tests[] = {
        cmocka_unit_test(hamming_test),
        cmocka_unit_test(test_bitset_lenrange_cardinality),
        cmocka_unit_test(printf_test),
        cmocka_unit_test(set_get_test),
        cmocka_unit_test(and_or_test),
        cmocka_unit_test(xor_test),
        cmocka_unit_test(andnot_test),
        cmocka_unit_test(to_uint32_array_test),
        cmocka_unit_test(select_test),
        cmocka_unit_test(test_bitset_compute_cardinality),
    };

    return cmocka_run_group_tests(tests, NULL, NULL);
}